

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall
CFFFileInput::ReadDict
          (CFFFileInput *this,unsigned_long inReadAmount,UShortToDictOperandListMap *outDict)

{
  EStatusCode EVar1;
  bool bVar2;
  LongFilePositionType LVar3;
  pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>
  local_98;
  Byte local_61;
  undefined1 local_60 [7];
  Byte aBuffer;
  DictOperand anOperand;
  undefined1 local_40 [2];
  unsigned_short anOperator;
  EStatusCode status;
  DictOperandList operands;
  LongFilePositionType dictStartPosition;
  UShortToDictOperandListMap *outDict_local;
  unsigned_long inReadAmount_local;
  CFFFileInput *this_local;
  
  operands.super__List_base<DictOperand,_std::allocator<DictOperand>_>._M_impl._M_node._M_size =
       CFFPrimitiveReader::GetCurrentPosition(&this->mPrimitivesReader);
  std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::list
            ((list<DictOperand,_std::allocator<DictOperand>_> *)local_40);
  anOperand.RealValueFractalEnd._4_4_ = eSuccess;
  while( true ) {
    bVar2 = false;
    if (anOperand.RealValueFractalEnd._4_4_ == eSuccess) {
      LVar3 = CFFPrimitiveReader::GetCurrentPosition(&this->mPrimitivesReader);
      bVar2 = (long)(LVar3 - operands.super__List_base<DictOperand,_std::allocator<DictOperand>_>.
                             _M_impl._M_node._M_size) < (long)inReadAmount;
    }
    if ((!bVar2) ||
       (anOperand.RealValueFractalEnd._4_4_ =
             CFFPrimitiveReader::ReadByte(&this->mPrimitivesReader,&local_61),
       anOperand.RealValueFractalEnd._4_4_ != eSuccess)) break;
    bVar2 = CFFPrimitiveReader::IsDictOperator(&this->mPrimitivesReader,local_61);
    if (bVar2) {
      anOperand.RealValueFractalEnd._4_4_ =
           CFFPrimitiveReader::ReadDictOperator
                     (&this->mPrimitivesReader,local_61,
                      (unsigned_short *)((long)&anOperand.RealValueFractalEnd + 2));
      if (anOperand.RealValueFractalEnd._4_4_ != eSuccess) break;
      std::
      pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>::
      pair<unsigned_short_&,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_&,_true>
                (&local_98,(unsigned_short *)((long)&anOperand.RealValueFractalEnd + 2),
                 (list<DictOperand,_std::allocator<DictOperand>_> *)local_40);
      std::
      map<unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
      ::insert(outDict,&local_98);
      std::
      pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>::
      ~pair(&local_98);
      std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::clear
                ((list<DictOperand,_std::allocator<DictOperand>_> *)local_40);
    }
    else {
      anOperand.RealValueFractalEnd._4_4_ =
           CFFPrimitiveReader::ReadDictOperand
                     (&this->mPrimitivesReader,local_61,(DictOperand *)local_60);
      if (anOperand.RealValueFractalEnd._4_4_ != eSuccess) break;
      std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::push_back
                ((list<DictOperand,_std::allocator<DictOperand>_> *)local_40,(value_type *)local_60)
      ;
    }
  }
  EVar1 = anOperand.RealValueFractalEnd._4_4_;
  std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::~list
            ((list<DictOperand,_std::allocator<DictOperand>_> *)local_40);
  return EVar1;
}

Assistant:

EStatusCode CFFFileInput::ReadDict(unsigned long inReadAmount,UShortToDictOperandListMap& outDict)
{
	LongFilePositionType dictStartPosition = mPrimitivesReader.GetCurrentPosition();
	DictOperandList operands;
	EStatusCode status = PDFHummus::eSuccess;
	unsigned short anOperator;
	DictOperand anOperand;
	Byte aBuffer;

	while(PDFHummus::eSuccess == status && 
			(mPrimitivesReader.GetCurrentPosition() - dictStartPosition < (long long)inReadAmount))
	{
		status = mPrimitivesReader.ReadByte(aBuffer);
		if(status != PDFHummus::eSuccess)
			break;
		if(mPrimitivesReader.IsDictOperator(aBuffer))
		{ // operator
			status = mPrimitivesReader.ReadDictOperator(aBuffer,anOperator);
			if(status != PDFHummus::eSuccess)
				break;
			outDict.insert(
				UShortToDictOperandListMap::value_type(anOperator,operands));
			operands.clear();
		}
		else // operand
		{
			status = mPrimitivesReader.ReadDictOperand(aBuffer,anOperand);
			if(status != PDFHummus::eSuccess)
				break;
			operands.push_back(anOperand);
		}
	}

	return status;
}